

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall comparer_context::cmp_bounds<aiVector3t<float>>(comparer_context *this,string *name)

{
  aiVector3D aVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  comparer_context *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::operator+(&local_38,name,".<minimum-value>");
  aVar1 = cmp<aiVector3t<float>>(this,&local_38);
  local_58 = aVar1.z;
  local_60 = aVar1._0_8_;
  local_50 = local_60;
  local_48 = local_58;
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_80,local_18,".<maximum-value>");
  cmp<aiVector3t<float>>(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmp_bounds(const std::string& name) {
        cmp<T> (name+".<minimum-value>");
        cmp<T> (name+".<maximum-value>");
    }